

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall gnuplotio::GnuplotTmpfile::~GnuplotTmpfile(GnuplotTmpfile *this)

{
  ostream *os;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  exception *anon_var_0;
  GnuplotTmpfile *this_local;
  
  if ((this->debug_messages & 1U) != 0) {
    os = std::operator<<((ostream *)&std::cerr,"delete tmpfile ");
    this_00 = boost::filesystem::operator<<(os,&this->file);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  boost::filesystem::remove((char *)this);
  boost::filesystem::path::~path(&this->file);
  return;
}

Assistant:

~GnuplotTmpfile() {
        if(debug_messages) {
            std::cerr << "delete tmpfile " << file << std::endl;
        }
        // it is never good to throw exceptions from a destructor
        try {
            remove(file);
        } catch(const std::exception &) {
            std::cerr << "Failed to remove temporary file " << file << std::endl;
        }
    }